

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmProjectCommand.cxx
# Opt level: O0

void TopLevelCMakeVarCondSet(cmMakefile *mf,string *name,string *value)

{
  bool bVar1;
  bool local_29;
  cmValue local_28;
  string *local_20;
  string *value_local;
  string *name_local;
  cmMakefile *mf_local;
  
  local_20 = value;
  value_local = name;
  name_local = (string *)mf;
  local_28 = cmMakefile::GetDefinition(mf,name);
  bVar1 = cmValue::operator_cast_to_bool(&local_28);
  local_29 = true;
  if (bVar1) {
    local_29 = cmMakefile::IsRootMakefile((cmMakefile *)name_local);
  }
  if (local_29 != false) {
    cmMakefile::RemoveDefinition((cmMakefile *)name_local,value_local);
    cmMakefile::AddCacheDefinition
              ((cmMakefile *)name_local,value_local,local_20,"Value Computed by CMake",STATIC,false)
    ;
  }
  return;
}

Assistant:

static void TopLevelCMakeVarCondSet(cmMakefile& mf, std::string const& name,
                                    std::string const& value)
{
  // Set the CMAKE_PROJECT_XXX variable to be the highest-level
  // project name in the tree. If there are two project commands
  // in the same CMakeLists.txt file, and it is the top level
  // CMakeLists.txt file, then go with the last one.
  if (!mf.GetDefinition(name) || mf.IsRootMakefile()) {
    mf.RemoveDefinition(name);
    mf.AddCacheDefinition(name, value, "Value Computed by CMake",
                          cmStateEnums::STATIC);
  }
}